

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void units::cleanDotNotation(string *unit_string,uint64_t match_flags)

{
  DotInterpretation DVar1;
  bool bVar2;
  reference pvVar3;
  size_type sVar4;
  size_type __pos;
  ulong in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_type slashloc;
  size_type nloc_1;
  size_type nloc;
  int skipped;
  size_type dloc;
  size_t st;
  DotInterpretation dInt;
  undefined7 in_stack_ffffffffffffffa8;
  char in_stack_ffffffffffffffaf;
  undefined6 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb6;
  undefined1 in_stack_ffffffffffffffb7;
  string *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  int local_2c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  
  DVar1 = findDotInterpretation(in_stack_ffffffffffffffb8);
  local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_ffffffffffffffb7,
                                    CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)),
                           in_stack_ffffffffffffffaf,0x7a3938);
  local_2c = 0;
  do {
    if (local_28 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffffffffffffffff) {
      if (1 < local_2c) {
        local_2c = 0;
        local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find_first_of
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_ffffffffffffffb7,
                                       CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)
                                      ),in_stack_ffffffffffffffaf,0x7a3b82);
        while (local_28 !=
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               0xffffffffffffffff) {
          do {
            pvVar3 = CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                               ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_ffffffffffffffb7,
                                          CONCAT16(in_stack_ffffffffffffffb6,
                                                   in_stack_ffffffffffffffb0)),
                                CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
            if (*pvVar3 == '.') goto LAB_007a3c02;
            pvVar3 = CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                               ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_ffffffffffffffb7,
                                          CONCAT16(in_stack_ffffffffffffffb6,
                                                   in_stack_ffffffffffffffb0)),
                                CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
            bVar2 = isDigitCharacter(*pvVar3);
          } while (bVar2);
          local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                     find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT17(in_stack_ffffffffffffffb7,
                                               CONCAT16(in_stack_ffffffffffffffb6,
                                                        in_stack_ffffffffffffffb0)),
                                   in_stack_ffffffffffffffaf,0x7a3beb);
LAB_007a3c02:
          pvVar3 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_ffffffffffffffb7,
                                       CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)
                                      ),
                              CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
          if (*pvVar3 == '.') {
            pvVar3 = CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                               ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_ffffffffffffffb7,
                                          CONCAT16(in_stack_ffffffffffffffb6,
                                                   in_stack_ffffffffffffffb0)),
                                CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
            *pvVar3 = '*';
            local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CLI::std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                       find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT17(in_stack_ffffffffffffffb7,
                                                 CONCAT16(in_stack_ffffffffffffffb6,
                                                          in_stack_ffffffffffffffb0)),
                                     in_stack_ffffffffffffffaf,0x7a3c43);
          }
          else {
            local_2c = local_2c + 1;
          }
        }
      }
      if (0 < local_2c) {
        local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find_first_of
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_ffffffffffffffb7,
                                       CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)
                                      ),in_stack_ffffffffffffffaf,0x7a3c7b);
        while (local_28 !=
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               0xffffffffffffffff) {
          do {
            in_stack_ffffffffffffffc0 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&local_28[-1].field_2 + 0xf);
            if (in_stack_ffffffffffffffc0 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
            goto LAB_007a3d0f;
            pvVar3 = CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                               ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_ffffffffffffffb7,
                                          CONCAT16(in_stack_ffffffffffffffb6,
                                                   in_stack_ffffffffffffffb0)),
                                CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
            bVar2 = isDigitCharacter(*pvVar3);
            local_28 = in_stack_ffffffffffffffc0;
          } while (bVar2);
          pvVar3 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_ffffffffffffffb7,
                                       CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)
                                      ),
                              CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
          if ((*pvVar3 == 'e') ||
             (pvVar3 = CLI::std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(in_stack_ffffffffffffffb7,
                                              CONCAT16(in_stack_ffffffffffffffb6,
                                                       in_stack_ffffffffffffffb0)),
                                  CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8)),
             *pvVar3 == 'E')) {
            pvVar3 = CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                               ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_ffffffffffffffb7,
                                          CONCAT16(in_stack_ffffffffffffffb6,
                                                   in_stack_ffffffffffffffb0)),
                                CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
            *pvVar3 = '*';
          }
LAB_007a3d0f:
          local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                     find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT17(in_stack_ffffffffffffffb7,
                                               CONCAT16(in_stack_ffffffffffffffb6,
                                                        in_stack_ffffffffffffffb0)),
                                   in_stack_ffffffffffffffaf,0x7a3d27);
        }
      }
      if (((in_RSI & 0x400) != 0) &&
         (__pos = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  find_last_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_ffffffffffffffb7,
                                        CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0
                                                )),in_stack_ffffffffffffffaf,0x7a3d5a),
         __pos != 0xffffffffffffffff)) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                  (in_stack_ffffffffffffffc0,__pos,
                   CONCAT17(in_stack_ffffffffffffffb7,
                            CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)),
                   in_stack_ffffffffffffffaf);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back(in_stack_ffffffffffffffc0,(char)(__pos >> 0x38));
      }
      return;
    }
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      sVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              size(in_RDI);
      if (1 < sVar4) {
        pvVar3 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_ffffffffffffffb7,
                                     CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)),
                            CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
        bVar2 = isDigitCharacter(*pvVar3);
        if (bVar2) {
          local_2c = local_2c + 1;
        }
        else if (DVar1 == multiply) {
          pvVar3 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_ffffffffffffffb7,
                                       CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)
                                      ),
                              CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
          *pvVar3 = '*';
        }
        else {
          while( true ) {
            pvVar3 = CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                               ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_ffffffffffffffb7,
                                          CONCAT16(in_stack_ffffffffffffffb6,
                                                   in_stack_ffffffffffffffb0)),
                                CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
            in_stack_ffffffffffffffb6 = true;
            if (*pvVar3 != '.') {
              pvVar3 = CLI::std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(in_stack_ffffffffffffffb7,
                                              CONCAT16(1,in_stack_ffffffffffffffb0)),
                                  CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
              in_stack_ffffffffffffffb6 = *pvVar3 == ' ';
            }
            if ((bool)in_stack_ffffffffffffffb6 == false) break;
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            erase(in_stack_ffffffffffffffc0,(size_type)in_stack_ffffffffffffffb8,
                  CONCAT17(in_stack_ffffffffffffffb7,
                           CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)));
          }
        }
      }
    }
    else {
      pvVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_ffffffffffffffb7,
                                     CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)),
                            CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
      bVar2 = isDigitCharacter(*pvVar3);
      if (bVar2) {
        pvVar3 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_ffffffffffffffb7,
                                     CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)),
                            CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
        bVar2 = isDigitCharacter(*pvVar3);
        if (bVar2) {
          local_2c = local_2c + 1;
          goto LAB_007a3b30;
        }
      }
      pvVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_ffffffffffffffb7,
                                     CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)),
                            CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
      if (*pvVar3 == '*') {
        local_2c = local_2c + 1;
      }
      else if (DVar1 == multiply) {
        pvVar3 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_ffffffffffffffb7,
                                     CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)),
                            CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
        *pvVar3 = '*';
      }
      else {
        while( true ) {
          pvVar3 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_ffffffffffffffb7,
                                       CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)
                                      ),
                              CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
          in_stack_ffffffffffffffb7 = true;
          if (*pvVar3 != '.') {
            pvVar3 = CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                               ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(1,CONCAT16(in_stack_ffffffffffffffb6,
                                                     in_stack_ffffffffffffffb0)),
                                CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
            in_stack_ffffffffffffffb7 = *pvVar3 == ' ';
          }
          if ((bool)in_stack_ffffffffffffffb7 == false) break;
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          erase(in_stack_ffffffffffffffc0,(size_type)in_stack_ffffffffffffffb8,
                CONCAT17(in_stack_ffffffffffffffb7,
                         CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)));
        }
      }
    }
LAB_007a3b30:
    local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_ffffffffffffffb7,
                                        CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0
                                                )),in_stack_ffffffffffffffaf,0x7a3b52);
  } while( true );
}

Assistant:

static void
    cleanDotNotation(std::string& unit_string, std::uint64_t match_flags)
{
    const auto dInt = findDotInterpretation(unit_string);

    // replace all dots with '*'
    size_t st = 0;
    auto dloc = unit_string.find_first_of('.');
    int skipped{0};
    while (dloc != std::string::npos) {
        if (dloc > 0) {
            if (!isDigitCharacter(unit_string[dloc - 1]) ||
                !isDigitCharacter(unit_string[dloc + 1])) {
                if (unit_string[dloc - 1] == '*') {
                    ++skipped;
                } else {
                    if (dInt == DotInterpretation::multiply) {
                        unit_string[dloc] = '*';
                    } else {
                        while (unit_string[dloc] == '.' ||
                               unit_string[dloc] == ' ') {
                            unit_string.erase(dloc, 1);
                        }
                        --dloc;
                    }
                }
            } else {
                ++skipped;
            }
        } else if (unit_string.size() > 1) {
            if (!isDigitCharacter(unit_string[dloc + 1])) {
                if (dInt == DotInterpretation::multiply) {
                    unit_string[dloc] = '*';
                } else {
                    while (unit_string[dloc] == '.' ||
                           unit_string[dloc] == ' ') {
                        unit_string.erase(dloc, 1);
                    }
                    --dloc;
                }
            } else {
                ++skipped;
            }
        }
        st = dloc + 1;
        dloc = unit_string.find_first_of('.', st);
    }

    if (skipped > 1) {
        /* this is needed for some sequential conditions with unusual dot
         * notation that forces some to be a multiply
         */
        skipped = 0;
        dloc = unit_string.find_first_of('.');
        while (dloc != std::string::npos) {
            auto nloc = dloc + 1;
            while (unit_string[nloc] != '.') {
                if (!isDigitCharacter(unit_string[nloc])) {
                    dloc = unit_string.find_first_of('.', nloc + 1);
                    break;
                }
                ++nloc;
            }
            if (unit_string[nloc] == '.') {
                unit_string[nloc] = '*';
                dloc = unit_string.find_first_of('.', nloc + 1);
            } else {
                ++skipped;
            }
        }
    }
    if (skipped >
        0) {  // check for exponents which can't have dots so must be multiply
        dloc = unit_string.find_first_of('.', 2);
        while (dloc != std::string::npos) {
            auto nloc = dloc - 1;
            while (nloc > 0) {
                if (!isDigitCharacter(unit_string[nloc])) {
                    if (unit_string[nloc] == 'e' || unit_string[nloc] == 'E') {
                        unit_string[dloc] = '*';
                    }
                    break;
                }
                --nloc;
            }
            dloc = unit_string.find_first_of('.', dloc + 1);
        }
    }
    if ((match_flags & single_slash) != 0) {
        auto slashloc = unit_string.find_last_of('/');
        if (slashloc != std::string::npos) {
            unit_string.insert(slashloc + 1, 1, '(');
            unit_string.push_back(')');
        }
    }
}